

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O0

bool __thiscall w3Module::read_mutable(w3Module *this,uint8_t **cursor)

{
  byte bVar1;
  allocator<char> local_41;
  string local_40;
  uint local_1c;
  uint8_t **ppuStack_18;
  uint32_t m;
  uint8_t **cursor_local;
  w3Module *this_local;
  
  ppuStack_18 = cursor;
  cursor_local = (uint8_t **)this;
  bVar1 = read_byte(this,cursor);
  local_1c = (uint)bVar1;
  if (1 < local_1c) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"invalid mutable",&local_41);
    ThrowString(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return local_1c == 1;
}

Assistant:

bool w3Module::read_mutable (uint8_t** cursor)
{
    const uint32_t m = read_byte (cursor);
    switch (m)
    {
    case 0:
    case 1: break;
    default:
        ThrowString ("invalid mutable");
    }
    return m == 1;
}